

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr162.cpp
# Opt level: O2

CheckValue<double> IKPowWithIntegerCheck<double>(double f,int n)

{
  undefined8 in_RAX;
  uint uVar1;
  double dVar2;
  CheckValue<double> CVar3;
  CheckValue<double> CVar4;
  
  CVar3._8_8_ = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (n == 0) {
    f = 1.0;
LAB_00118783:
    CVar3.value = f;
    return CVar3;
  }
  if (n == 1) goto LAB_00118783;
  if (n < 0) {
    if ((f == 0.0) && (!NAN(f))) {
      return (CheckValue<double>)ZEXT816(0x46293e5939a08cea);
    }
    if (n == -1) {
      dVar2 = 1.0 / f;
      goto LAB_001187b7;
    }
  }
  uVar1 = -n;
  if (0 < n) {
    uVar1 = n;
  }
  if (uVar1 == 2) {
    dVar2 = f * f;
  }
  else if (uVar1 == 3) {
    dVar2 = f * f * f;
  }
  else {
    dVar2 = 1.0;
    for (; uVar1 != 0; uVar1 = uVar1 >> 1) {
      if ((uVar1 & 1) != 0) {
        dVar2 = dVar2 * f;
      }
      f = f * f;
    }
  }
  if (n < 0) {
    dVar2 = 1.0 / dVar2;
  }
LAB_001187b7:
  CVar4._8_8_ = CVar3._8_8_;
  CVar4.value = dVar2;
  return CVar4;
}

Assistant:

inline CheckValue<T> IKPowWithIntegerCheck(T f, int n)
{
    CheckValue<T> ret;
    ret.valid = true;
    if( n == 0 ) {
        ret.value = 1.0;
        return ret;
    }
    else if( n == 1 )
    {
        ret.value = f;
        return ret;
    }
    else if( n < 0 )
    {
        if( f == 0 )
        {
            ret.valid = false;
            ret.value = (T)1.0e30;
            return ret;
        }
        if( n == -1 ) {
            ret.value = T(1.0)/f;
            return ret;
        }
    }

    int num = n > 0 ? n : -n;
    if( num == 2 ) {
        ret.value = f*f;
    }
    else if( num == 3 ) {
        ret.value = f*f*f;
    }
    else {
        ret.value = 1.0;
        while(num>0) {
            if( num & 1 ) {
                ret.value *= f;
            }
            num >>= 1;
            f *= f;
        }
    }
    
    if( n < 0 ) {
        ret.value = T(1.0)/ret.value;
    }
    return ret;
}